

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

Type wasm::Type::getGreatestLowerBound(Type a,Type b)

{
  bool bVar1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  size_t sVar4;
  size_t sVar5;
  Type *pTVar6;
  uintptr_t extraout_RDX;
  uintptr_t extraout_RDX_00;
  HeapType b_00;
  HeapType b_01;
  Nullability nullable;
  Exactness exact;
  Type TVar7;
  Type local_88;
  Type glb;
  HeapType heapB;
  pointer local_70;
  HeapType HStack_68;
  HeapType heapA;
  Type local_48;
  Type local_40;
  Type b_local;
  Type a_local;
  
  TVar7.id = a.id;
  if (a.id != b.id) {
    local_40.id = b.id;
    b_local.id = a.id;
    if (((a.id & 1) != 0 && 6 < a.id) && ((b.id & 1) != 0 && 6 < b.id)) {
      sVar4 = size(&b_local);
      sVar5 = size(&local_40);
      if (sVar4 == sVar5) {
        HStack_68.id = 0;
        heapA.id = 0;
        sVar4 = size(&b_local);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,sVar4
                  );
        if (sVar4 != 0) {
          sVar5 = 0;
          do {
            glb.id = (uintptr_t)&b_local;
            pTVar6 = Iterator::operator*((Iterator *)&glb);
            TVar7.id = pTVar6->id;
            glb.id = (uintptr_t)&local_40;
            pTVar6 = Iterator::operator*((Iterator *)&glb);
            local_88 = getGreatestLowerBound(TVar7,pTVar6->id);
            if (local_88.id == 1) {
              local_48.id = 1;
              goto LAB_00cad3d3;
            }
            if (heapA.id == 0) {
              std::vector<wasm::Type,std::allocator<wasm::Type>>::
              _M_realloc_insert<wasm::Type_const&>
                        ((vector<wasm::Type,std::allocator<wasm::Type>> *)&stack0xffffffffffffff98,
                         (iterator)0x0,&local_88);
            }
            else {
              *(uintptr_t *)heapA.id = local_88.id;
              heapA.id = heapA.id + 8;
            }
            sVar5 = sVar5 + 1;
          } while (sVar4 != sVar5);
        }
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&glb,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98);
        Type(&local_48,(Tuple *)&glb);
        if (glb.id != 0) {
          operator_delete((void *)glb.id,(long)local_70 - glb.id);
        }
LAB_00cad3d3:
        if ((pointer)HStack_68.id == (pointer)0x0) {
          return (Type)local_48.id;
        }
        operator_delete((void *)HStack_68.id,-HStack_68.id);
        return (Type)local_48.id;
      }
    }
    if (((b_local.id & 1) == 0 && 6 < b_local.id) && (6 < local_40.id && (local_40.id & 1) == 0)) {
      HStack_68 = getHeapType(&b_local);
      glb.id = (uintptr_t)getHeapType(&local_40);
      BVar2 = HeapType::getBottom(&stack0xffffffffffffff98);
      BVar3 = HeapType::getBottom((HeapType *)&glb);
      if (BVar2 == BVar3) {
        nullable = NonNullable;
        if (b_local.id < 7 || (b_local.id & 3) != 0) {
          nullable = (Nullability)((local_40.id & 3) != 0 || local_40.id < 7);
        }
        bVar1 = isExact(&b_local);
        exact = Exact;
        b_00.id = extraout_RDX;
        if (!bVar1) {
          bVar1 = isExact(&local_40);
          exact = (Exactness)bVar1;
          b_00.id = extraout_RDX_00;
        }
        TVar7.id = HStack_68.id;
        if ((((HStack_68.id != glb.id) &&
             (bVar1 = anon_unknown_0::SubTyper::isSubType
                                ((SubTyper *)HStack_68.id,(HeapType)glb.id,b_00),
             TVar7.id = HStack_68.id, !bVar1)) && (glb.id != HStack_68.id)) &&
           (bVar1 = anon_unknown_0::SubTyper::isSubType((SubTyper *)glb.id,HStack_68,b_01),
           TVar7 = glb, !bVar1)) {
          BVar2 = HeapType::getBottom(&stack0xffffffffffffff98);
          TVar7.id = (uintptr_t)BVar2;
        }
        bVar1 = isExact(&b_local);
        if (((bVar1) && (TVar7.id != HStack_68.id)) ||
           ((bVar1 = isExact(&local_40), bVar1 && (TVar7.id != glb.id)))) {
          BVar2 = HeapType::getBottom(&stack0xffffffffffffff98);
          TVar7.id = (uintptr_t)BVar2;
          exact = Inexact;
        }
        Type(&local_48,(HeapType)TVar7.id,nullable,exact);
        return (Type)local_48.id;
      }
    }
    local_48.id = 1;
    TVar7.id = local_48.id;
  }
  local_48.id = TVar7.id;
  return (Type)local_48.id;
}

Assistant:

Type Type::getGreatestLowerBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a.isTuple() && b.isTuple() && a.size() == b.size()) {
    std::vector<Type> elems;
    size_t size = a.size();
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto glb = Type::getGreatestLowerBound(a[i], b[i]);
      if (glb == Type::unreachable) {
        return Type::unreachable;
      }
      elems.push_back(glb);
    }
    return Tuple(elems);
  }
  if (!a.isRef() || !b.isRef()) {
    return Type::unreachable;
  }
  auto heapA = a.getHeapType();
  auto heapB = b.getHeapType();
  if (heapA.getBottom() != heapB.getBottom()) {
    return Type::unreachable;
  }
  auto nullability =
    (a.isNonNullable() || b.isNonNullable()) ? NonNullable : Nullable;
  auto exactness = (a.isExact() || b.isExact()) ? Exact : Inexact;
  HeapType heapType;
  if (HeapType::isSubType(heapA, heapB)) {
    heapType = heapA;
  } else if (HeapType::isSubType(heapB, heapA)) {
    heapType = heapB;
  } else {
    heapType = heapA.getBottom();
  }
  // If one of the types is exact, but the GLB heap type is different than its
  // heap type, then we must make the GLB heap type bottom.
  if ((a.isExact() && heapType != heapA) ||
      (b.isExact() && heapType != heapB)) {
    heapType = heapA.getBottom();
    exactness = Inexact;
  }
  return Type(heapType, nullability, exactness);
}